

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O2

void Gia_ManEquivFixOutputPairs(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  Gia_Obj_t *pObj;
  Gia_Obj_t *pObj_00;
  int iVar3;
  int v;
  
  iVar1 = p->vCos->nSize;
  iVar3 = p->nRegs;
  if ((iVar1 - iVar3 & 1U) != 0) {
    __assert_fail("(Gia_ManPoNum(p) & 1) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                  ,0x339,"void Gia_ManEquivFixOutputPairs(Gia_Man_t *)");
  }
  v = 0;
  while( true ) {
    if (iVar1 - iVar3 <= v) {
      return;
    }
    pObj = Gia_ManCo(p,v);
    if (pObj == (Gia_Obj_t *)0x0) break;
    pObj_00 = Gia_ManPo(p,v + 1);
    if (((ulong)((uint)(*(ulong *)pObj >> 0x1d) & 1) ^
        (ulong)(pObj + -(*(ulong *)pObj & 0x1fffffff))) ==
        ((ulong)((uint)(*(ulong *)pObj_00 >> 0x1d) & 1) ^
        (ulong)(pObj_00 + -(*(ulong *)pObj_00 & 0x1fffffff)))) {
      uVar2 = Gia_ObjId(p,pObj);
      *(ulong *)pObj = *(ulong *)pObj & 0xffffffffc0000000 | (ulong)(uVar2 & 0x1fffffff);
      uVar2 = Gia_ObjId(p,pObj_00);
      *(ulong *)pObj_00 = *(ulong *)pObj_00 & 0xffffffffc0000000 | (ulong)(uVar2 & 0x1fffffff);
    }
    iVar1 = p->vCos->nSize;
    iVar3 = p->nRegs;
    v = v + 2;
  }
  return;
}

Assistant:

void Gia_ManEquivFixOutputPairs( Gia_Man_t * p )
{
    Gia_Obj_t * pObj0, * pObj1;
    int i;
    assert( (Gia_ManPoNum(p) & 1) == 0 );
    Gia_ManForEachPo( p, pObj0, i )
    {
        pObj1 = Gia_ManPo( p, ++i );
        if ( Gia_ObjChild0(pObj0) != Gia_ObjChild0(pObj1) )
            continue;
        pObj0->iDiff0  = Gia_ObjId(p, pObj0);
        pObj0->fCompl0 = 0;
        pObj1->iDiff0  = Gia_ObjId(p, pObj1);
        pObj1->fCompl0 = 0;
    }
}